

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

uint32_t __thiscall
asmjit::CodeHolder::labelIdByName(CodeHolder *this,char *name,size_t nameSize,uint32_t parentId)

{
  uint32_t uVar1;
  LabelEntry *pLVar2;
  size_t nameSize_local;
  LabelByName local_38;
  
  nameSize_local = nameSize;
  uVar1 = CodeHolder_hashNameAndGetSize(name,&nameSize_local);
  if (nameSize_local == 0) {
    uVar1 = 0;
  }
  else {
    local_38._hashCode = 0;
    if (parentId != 0xffffffff) {
      local_38._hashCode = parentId;
    }
    local_38._hashCode = uVar1 ^ local_38._hashCode;
    local_38._keySize = (uint32_t)nameSize_local;
    local_38._key = name;
    local_38._parentId = parentId;
    pLVar2 = ZoneHash<asmjit::LabelEntry>::get<asmjit::LabelByName>(&this->_namedLabels,&local_38);
    if (pLVar2 == (LabelEntry *)0x0) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = *(uint32_t *)&pLVar2->field_0xc;
    }
  }
  return uVar1;
}

Assistant:

uint32_t CodeHolder::labelIdByName(const char* name, size_t nameSize, uint32_t parentId) noexcept {
  uint32_t hashCode = CodeHolder_hashNameAndGetSize(name, nameSize);
  if (ASMJIT_UNLIKELY(!nameSize))
    return 0;

  if (parentId != Globals::kInvalidId)
    hashCode ^= parentId;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameSize, hashCode, parentId));
  return le ? le->id() : uint32_t(Globals::kInvalidId);
}